

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleUVRowDownEven_C
               (uint8_t *src_uv,ptrdiff_t src_stride,int src_stepx,uint8_t *dst_uv,int dst_width)

{
  uint16_t *dst;
  long lVar1;
  uint16_t *src;
  
  for (lVar1 = 0; (int)lVar1 < dst_width + -1; lVar1 = lVar1 + 2) {
    *(undefined2 *)(dst_uv + lVar1 * 2) = *(undefined2 *)src_uv;
    *(undefined2 *)(dst_uv + lVar1 * 2 + 2) = *(undefined2 *)(src_uv + (long)src_stepx * 2);
    src_uv = src_uv + (long)(src_stepx * 2) * 2;
  }
  if ((dst_width & 1U) != 0) {
    *(undefined2 *)(dst_uv + lVar1 * 2) = *(undefined2 *)src_uv;
  }
  return;
}

Assistant:

void ScaleUVRowDownEven_C(const uint8_t* src_uv,
                          ptrdiff_t src_stride,
                          int src_stepx,
                          uint8_t* dst_uv,
                          int dst_width) {
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  (void)src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src[0];
    dst[1] = src[src_stepx];
    src += src_stepx * 2;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[0];
  }
}